

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  bool bVar2;
  reference ppcVar3;
  cmState *this_00;
  Snapshot local_70;
  undefined1 local_48 [8];
  string name;
  long line;
  string *filenametoread_local;
  cmMakefile *mf_local;
  ListFileScope *this_local;
  
  this->Makefile = mf;
  this->ReportError = true;
  name.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_48);
  bVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::empty
                    (&this->Makefile->ContextStack);
  if (!bVar2) {
    ppcVar3 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->Makefile->ContextStack);
    name.field_2._8_8_ = (*ppcVar3)->Line;
    ppcVar3 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->Makefile->ContextStack);
    std::__cxx11::string::operator=((string *)local_48,(string *)*ppcVar3);
  }
  this_00 = GetState(this->Makefile);
  cmState::CreateInlineListFileSnapshot
            (&local_70,this_00,this->Makefile->StateSnapshot,(string *)local_48,name.field_2._8_8_,
             filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_70.Position.Position;
  (pcVar1->StateSnapshot).State = local_70.State;
  (pcVar1->StateSnapshot).Position.Tree = local_70.Position.Tree;
  bVar2 = cmState::Snapshot::IsValid(&this->Makefile->StateSnapshot);
  if (!bVar2) {
    __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                  ,0x1f7,
                  "cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)");
  }
  PushFunctionBlockerBarrier(this->Makefile);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf), ReportError(true)
  {
    long line = 0;
    std::string name;
    if (!this->Makefile->ContextStack.empty())
      {
      line = this->Makefile->ContextStack.back()->Line;
      name = this->Makefile->ContextStack.back()->Name;
      }
    this->Makefile->StateSnapshot =
        this->Makefile->GetState()->CreateInlineListFileSnapshot(
          this->Makefile->StateSnapshot, name, line, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }